

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O0

void __thiscall NodeKey::dump(NodeKey *this)

{
  bool bVar1;
  uint32_t uVar2;
  ostream *poVar3;
  void *pvVar4;
  char *pcVar5;
  NodeKey *in_RDI;
  
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,std::hex);
  poVar3 = std::operator<<(poVar3,"Flags: 0x");
  uVar2 = flags(in_RDI);
  pvVar4 = (void *)std::ostream::operator<<(poVar3,uVar2);
  poVar3 = (ostream *)std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"Size1: 0x");
  uVar2 = size1(in_RDI);
  pvVar4 = (void *)std::ostream::operator<<(poVar3,uVar2);
  poVar3 = (ostream *)std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"Size2: 0x");
  uVar2 = size2(in_RDI);
  pvVar4 = (void *)std::ostream::operator<<(poVar3,uVar2);
  poVar3 = (ostream *)std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"Node index: 0x");
  uVar2 = nodeIndex(in_RDI);
  pvVar4 = (void *)std::ostream::operator<<(poVar3,uVar2);
  poVar3 = (ostream *)std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"Volume index: 0x");
  uVar2 = volumeIndex(in_RDI);
  pvVar4 = (void *)std::ostream::operator<<(poVar3,uVar2);
  poVar3 = (ostream *)std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"Sector index: 0x");
  uVar2 = sectorIndex(in_RDI);
  pvVar4 = (void *)std::ostream::operator<<(poVar3,uVar2);
  poVar3 = (ostream *)std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"Has compression: ");
  bVar1 = hasCompression(in_RDI);
  pcVar5 = "false";
  if (bVar1) {
    pcVar5 = "true";
  }
  poVar3 = std::operator<<(poVar3,pcVar5);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"Has bit 4: ");
  bVar1 = hasBit4(in_RDI);
  pcVar5 = "false";
  if (bVar1) {
    pcVar5 = "true";
  }
  poVar3 = std::operator<<(poVar3,pcVar5);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"Has bit 5: ");
  bVar1 = hasBit5(in_RDI);
  pcVar5 = "false";
  if (bVar1) {
    pcVar5 = "true";
  }
  poVar3 = std::operator<<(poVar3,pcVar5);
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::dec);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void NodeKey::dump() const
{
	std::cout
		<< std::hex
		<< "Flags: 0x" << flags() << std::endl
		<< "Size1: 0x" << size1() << std::endl
		<< "Size2: 0x" << size2() << std::endl
		<< "Node index: 0x" << nodeIndex() << std::endl
		<< "Volume index: 0x" << volumeIndex() << std::endl
		<< "Sector index: 0x" << sectorIndex() << std::endl
		<< "Has compression: " << (hasCompression() ? "true" : "false") << std::endl
		<< "Has bit 4: " << (hasBit4() ? "true" : "false") << std::endl
		<< "Has bit 5: " << (hasBit5() ? "true" : "false") << std::endl
		<< std::dec << std::endl;
}